

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_convert_pcm_frames_format
               (void *pOut,ma_format formatOut,void *pIn,ma_format formatIn,ma_uint64 frameCount,
               ma_uint32 channels,ma_dither_mode ditherMode)

{
  float fVar1;
  char cVar2;
  undefined4 uVar3;
  ma_uint8 *src_u8;
  byte *pbVar4;
  uint uVar5;
  long lVar6;
  ma_uint64 count;
  ulong uVar7;
  undefined1 *puVar8;
  char *pcVar9;
  int iVar10;
  double dVar11;
  float fVar12;
  double dVar13;
  
  count = channels * frameCount;
  if (formatOut == formatIn) {
    memcpy(pOut,pIn,count * (uint)(&DAT_001158a0)[formatOut]);
    return;
  }
  switch(formatIn) {
  case ma_format_u8:
    switch(formatOut) {
    case ma_format_s16:
      if (count != 0) {
        lVar6 = 0;
        do {
          *(ushort *)((long)pOut + lVar6 * 2) = (ushort)*(byte *)((long)pIn + lVar6) << 8 ^ 0x8000;
          lVar6 = lVar6 + 1;
        } while (count - lVar6 != 0);
      }
      break;
    case ma_format_s24:
      if (count != 0) {
        pcVar9 = (char *)((long)pOut + 2);
        lVar6 = 0;
        do {
          cVar2 = *(char *)((long)pIn + lVar6);
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          *pcVar9 = cVar2 + -0x80;
          lVar6 = lVar6 + 1;
          pcVar9 = pcVar9 + 3;
        } while (count - lVar6 != 0);
      }
      break;
    case ma_format_s32:
      if (count != 0) {
        lVar6 = 0;
        do {
          *(uint *)((long)pOut + lVar6 * 4) = (*(byte *)((long)pIn + lVar6) ^ 0xffffff80) << 0x18;
          lVar6 = lVar6 + 1;
        } while (count - lVar6 != 0);
      }
      break;
    case ma_format_f32:
      if (count != 0) {
        lVar6 = 0;
        do {
          *(float *)((long)pOut + lVar6 * 4) =
               (float)*(byte *)((long)pIn + lVar6) * 0.007843138 + -1.0;
          lVar6 = lVar6 + 1;
        } while (count - lVar6 != 0);
      }
    }
    break;
  case ma_format_s16:
    switch(formatOut) {
    case ma_format_u8:
      ma_pcm_s16_to_u8(pOut,pIn,count,ditherMode);
      return;
    case ma_format_s24:
      if (count != 0) {
        puVar8 = (undefined1 *)((long)pOut + 2);
        lVar6 = 0;
        do {
          puVar8[-2] = 0;
          puVar8[-1] = *(undefined1 *)((long)pIn + lVar6 * 2);
          *puVar8 = *(undefined1 *)((long)pIn + lVar6 * 2 + 1);
          lVar6 = lVar6 + 1;
          puVar8 = puVar8 + 3;
        } while (count - lVar6 != 0);
      }
      break;
    case ma_format_s32:
      if (count != 0) {
        lVar6 = 0;
        do {
          *(uint *)((long)pOut + lVar6 * 4) = (uint)*(ushort *)((long)pIn + lVar6 * 2) << 0x10;
          lVar6 = lVar6 + 1;
        } while (count - lVar6 != 0);
      }
      break;
    case ma_format_f32:
      if (count != 0) {
        lVar6 = 0;
        do {
          *(float *)((long)pOut + lVar6 * 4) =
               (float)(int)*(short *)((long)pIn + lVar6 * 2) * 3.0517578e-05;
          lVar6 = lVar6 + 1;
        } while (count - lVar6 != 0);
      }
    }
    break;
  case ma_format_s24:
    switch(formatOut) {
    case ma_format_u8:
      ma_pcm_s24_to_u8(pOut,pIn,count,ditherMode);
      return;
    case ma_format_s16:
      ma_pcm_s24_to_s16(pOut,pIn,count,ditherMode);
      return;
    case ma_format_s32:
      if (count != 0) {
        pbVar4 = (byte *)((long)pIn + 2);
        lVar6 = 0;
        do {
          *(uint *)((long)pOut + lVar6 * 4) =
               (uint)*pbVar4 << 0x18 | (uint)*(ushort *)(pbVar4 + -2) << 8;
          lVar6 = lVar6 + 1;
          pbVar4 = pbVar4 + 3;
        } while (count - lVar6 != 0);
      }
      break;
    case ma_format_f32:
      if (count != 0) {
        pbVar4 = (byte *)((long)pIn + 2);
        lVar6 = 0;
        do {
          *(float *)((long)pOut + lVar6 * 4) =
               (float)((int)((uint)*pbVar4 << 0x18 | (uint)*(ushort *)(pbVar4 + -2) << 8) >> 8) *
               1.1920929e-07;
          lVar6 = lVar6 + 1;
          pbVar4 = pbVar4 + 3;
        } while (count - lVar6 != 0);
      }
    }
    break;
  case ma_format_s32:
    switch(formatOut) {
    case ma_format_u8:
      ma_pcm_s32_to_u8(pOut,pIn,count,ditherMode);
      return;
    case ma_format_s16:
      ma_pcm_s32_to_s16(pOut,pIn,count,ditherMode);
      return;
    case ma_format_s24:
      if (count != 0) {
        puVar8 = (undefined1 *)((long)pOut + 2);
        lVar6 = 0;
        do {
          uVar3 = *(undefined4 *)((long)pIn + lVar6 * 4);
          puVar8[-2] = (char)((uint)uVar3 >> 8);
          puVar8[-1] = (char)((uint)uVar3 >> 0x10);
          *puVar8 = (char)((uint)uVar3 >> 0x18);
          lVar6 = lVar6 + 1;
          puVar8 = puVar8 + 3;
        } while (count - lVar6 != 0);
      }
      break;
    case ma_format_f32:
      if (count != 0) {
        lVar6 = 0;
        do {
          *(float *)((long)pOut + lVar6 * 4) = (float)*(int *)((long)pIn + lVar6 * 4) * 4.656613e-10
          ;
          lVar6 = lVar6 + 1;
        } while (count - lVar6 != 0);
      }
    }
    break;
  case ma_format_f32:
    switch(formatOut) {
    case ma_format_u8:
      ma_pcm_f32_to_u8(pOut,pIn,count,ditherMode);
      return;
    case ma_format_s16:
      ma_pcm_f32_to_s16(pOut,pIn,count,ditherMode);
      return;
    case ma_format_s24:
      if (count != 0) {
        puVar8 = (undefined1 *)((long)pOut + 2);
        lVar6 = 0;
        do {
          fVar1 = *(float *)((long)pIn + lVar6 * 4);
          iVar10 = -0x7fffff;
          if (-1.0 <= fVar1) {
            fVar12 = 1.0;
            if (fVar1 <= 1.0) {
              fVar12 = fVar1;
            }
            iVar10 = (int)(fVar12 * 8388607.0);
          }
          puVar8[-2] = (char)iVar10;
          puVar8[-1] = (char)((uint)iVar10 >> 8);
          *puVar8 = (char)((uint)iVar10 >> 0x10);
          lVar6 = lVar6 + 1;
          puVar8 = puVar8 + 3;
        } while (count - lVar6 != 0);
      }
      break;
    case ma_format_s32:
      if (count != 0) {
        uVar5 = 1;
        uVar7 = 0;
        do {
          fVar1 = *(float *)((long)pIn + uVar7 * 4);
          iVar10 = -0x7fffffff;
          if (-1.0 <= fVar1) {
            dVar11 = (double)fVar1;
            dVar13 = 1.0;
            if (dVar11 <= 1.0) {
              dVar13 = dVar11;
            }
            iVar10 = (int)(dVar13 * 2147483647.0);
          }
          *(int *)((long)pOut + uVar7 * 4) = iVar10;
          uVar7 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar7 <= count && count - uVar7 != 0);
      }
    }
  }
  return;
}

Assistant:

MA_API void ma_convert_pcm_frames_format(void* pOut, ma_format formatOut, const void* pIn, ma_format formatIn, ma_uint64 frameCount, ma_uint32 channels, ma_dither_mode ditherMode)
{
    ma_pcm_convert(pOut, formatOut, pIn, formatIn, frameCount * channels, ditherMode);
}